

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  FieldDescriptor *pFVar1;
  uint *puVar2;
  once_flag *__once;
  Reflection *pRVar3;
  Descriptor *pDVar4;
  bool bVar5;
  DescriptorPool *pDVar6;
  mapped_type *ppTVar7;
  mapped_type pTVar8;
  MessageFactory *pMVar9;
  undefined4 extraout_var;
  uint *puVar10;
  LogMessage *pLVar11;
  long *plVar12;
  DynamicMessage *this_00;
  Reflection *this_01;
  DescriptorPool *pDVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  Descriptor *local_98;
  FieldDescriptor *local_90;
  uint *local_88;
  mapped_type local_80;
  DynamicMessageFactory *local_78;
  long local_70;
  undefined1 local_68 [24];
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_98 = type;
  if ((this->delegate_to_generated_factory_ == true) &&
     (pDVar13 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10),
     pDVar6 = DescriptorPool::generated_pool(), pDVar13 == pDVar6)) {
    pMVar9 = MessageFactory::generated_factory();
    iVar20 = (*pMVar9->_vptr_MessageFactory[2])(pMVar9,local_98);
    return (Message *)CONCAT44(extraout_var,iVar20);
  }
  ppTVar7 = std::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(this->prototypes_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_false>
                            ._M_head_impl,&local_98);
  if (*ppTVar7 == (mapped_type)0x0) {
    pTVar8 = (mapped_type)operator_new(0x58);
    pTVar8->offsets =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    pTVar8->has_bits_indices =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    pTVar8->reflection =
         (__uniq_ptr_data<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>,_true,_true>
          )0x0;
    pTVar8->prototype = (DynamicMessage *)0x0;
    *ppTVar7 = pTVar8;
    pTVar8->type = local_98;
    pDVar13 = this->pool_;
    if (pDVar13 == (DescriptorPool *)0x0) {
      pDVar13 = *(DescriptorPool **)(*(long *)(local_98 + 0x10) + 0x10);
    }
    pTVar8->pool = pDVar13;
    pTVar8->factory = this;
    uVar18 = 0xffffffffffffffff;
    if (-1 < (int)((long)*(int *)(local_98 + 0x6c) + (long)*(int *)(local_98 + 0x68))) {
      uVar18 = ((long)*(int *)(local_98 + 0x6c) + (long)*(int *)(local_98 + 0x68)) * 4;
    }
    local_88 = (uint *)operator_new__(uVar18);
    puVar10 = (pTVar8->offsets)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    (pTVar8->offsets)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
    ._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = local_88;
    if (puVar10 != (uint *)0x0) {
      operator_delete__(puVar10);
    }
    pDVar4 = local_98;
    if (*(int *)(*(long *)(local_98 + 0x10) + 0x3c) == 3) {
      pTVar8->has_bits_offset = -1;
      uVar19 = 0x20;
    }
    else {
      pTVar8->has_bits_offset = 0x20;
      iVar20 = *(int *)(local_98 + 0x68);
      iVar14 = iVar20 + 0x3e;
      if (-1 < iVar20 + 0x1f) {
        iVar14 = iVar20 + 0x1f;
      }
      uVar15 = (iVar14 >> 5) * 4 + 0x27;
      uVar19 = (iVar14 >> 5) * 4 + 0x2e;
      if (-1 < (int)uVar15) {
        uVar19 = uVar15;
      }
      uVar18 = 0xffffffffffffffff;
      if (-1 < (long)iVar20) {
        uVar18 = (long)iVar20 * 4;
      }
      puVar10 = (uint *)operator_new__(uVar18);
      if (0 < *(int *)(pDVar4 + 0x68)) {
        lVar16 = 0;
        do {
          puVar10[lVar16] = (uint)lVar16;
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)(pDVar4 + 0x68));
      }
      uVar19 = uVar19 & 0xfffffff8;
      puVar2 = (pTVar8->has_bits_indices)._M_t.
               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      (pTVar8->has_bits_indices)._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar10;
      if (puVar2 != (uint *)0x0) {
        operator_delete__(puVar2);
      }
    }
    iVar20 = *(int *)(local_98 + 0x6c);
    if (0 < iVar20) {
      pTVar8->oneof_case_offset = uVar19;
      uVar15 = uVar19 + iVar20 * 4 + 7;
      uVar19 = uVar19 + iVar20 * 4 + 0xe;
      if (-1 < (int)uVar15) {
        uVar19 = uVar15;
      }
      uVar19 = uVar19 & 0xfffffff8;
    }
    if (*(int *)(local_98 + 0x78) < 1) {
      pTVar8->extensions_offset = -1;
    }
    else {
      pTVar8->extensions_offset = uVar19;
      uVar15 = uVar19 + 0x26;
      if (-1 < (int)(uVar19 + 0x1f)) {
        uVar15 = uVar19 + 0x1f;
      }
      uVar19 = uVar15 & 0xfffffff8;
    }
    puVar10 = local_88;
    local_80 = pTVar8;
    local_78 = this;
    if (0 < *(int *)(local_98 + 0x68)) {
      lVar21 = 0;
      lVar16 = 0;
      do {
        lVar22 = *(long *)(local_98 + 0x28);
        if (*(long *)(lVar22 + 0x58 + lVar21) == 0) {
          pFVar1 = (FieldDescriptor *)(lVar22 + lVar21);
          __once = *(once_flag **)(lVar22 + 0x30 + lVar21);
          if (*(int *)(lVar22 + 0x3c + lVar21) == 3) {
            if (__once != (once_flag *)0x0) {
              local_68._0_8_ = FieldDescriptor::TypeOnceInit;
              local_90 = pFVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_90);
            }
            iVar20 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(uint *)(lVar22 + 0x38 + lVar21) * 4);
            uVar15 = 0x10;
            if (7 < iVar20 - 1U) {
              if (iVar20 == 9) {
                uVar15 = 0x18;
              }
              else {
                if (iVar20 != 10) goto LAB_002fe949;
                bVar5 = anon_unknown_0::IsMapFieldInApi(pFVar1);
                uVar15 = 0x18;
                if (bVar5) {
                  uVar15 = 0x68;
                }
              }
            }
          }
          else {
            if (__once != (once_flag *)0x0) {
              local_68._0_8_ = FieldDescriptor::TypeOnceInit;
              local_90 = pFVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_90);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(uint *)(lVar22 + 0x38 + lVar21) * 4) - 1U < 10) {
              uVar15 = *(uint *)(&DAT_00574948 +
                                (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                                (ulong)*(uint *)(lVar22 + 0x38 + lVar21) * 4) - 1U)
                                * 4);
            }
            else {
LAB_002fe949:
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
                         ,0xab);
              pLVar11 = internal::LogMessage::operator<<((LogMessage *)local_68,"Can\'t get here.");
              internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar11);
              internal::LogMessage::~LogMessage((LogMessage *)local_68);
              uVar15 = 0;
            }
          }
          uVar17 = 8;
          if (uVar15 < 8) {
            uVar17 = uVar15;
          }
          iVar20 = uVar19 + uVar17 + -1;
          uVar19 = iVar20 - iVar20 % (int)uVar17;
          local_88[lVar16] = uVar19;
          uVar19 = uVar19 + uVar15;
          puVar10 = local_88;
        }
        lVar16 = lVar16 + 1;
        lVar21 = lVar21 + 0x98;
      } while (lVar16 < *(int *)(local_98 + 0x68));
    }
    if (*(int *)(local_98 + 0x6c) < 1) {
      bVar5 = false;
    }
    else {
      lVar16 = 0;
      do {
        uVar15 = uVar19 + 0xe;
        if (-1 < (int)(uVar19 + 7)) {
          uVar15 = uVar19 + 7;
        }
        puVar10[*(int *)(local_98 + 0x68) + lVar16] = uVar15 & 0xfffffff8;
        uVar19 = (uVar15 & 0xfffffff8) + 8;
        lVar16 = lVar16 + 1;
      } while ((int)lVar16 < *(int *)(local_98 + 0x6c));
      bVar5 = 0 < *(int *)(local_98 + 0x6c);
    }
    uVar15 = uVar19 + 0xe;
    if (-1 < (int)(uVar19 + 7)) {
      uVar15 = uVar19 + 7;
    }
    local_80->internal_metadata_offset = uVar15 & 0xfffffff8;
    iVar20 = (uVar15 & 0xfffffff8) + 8;
    local_80->weak_field_map_offset = -1;
    local_80->size = iVar20;
    if ((bVar5) && (0 < *(int *)(local_98 + 0x6c))) {
      lVar16 = 0;
      do {
        lVar21 = *(long *)(local_98 + 0x30);
        lVar22 = lVar16 * 0x30;
        local_70 = lVar16;
        if (0 < *(int *)(lVar21 + 0x18 + lVar22)) {
          lVar16 = 0;
          do {
            pFVar1 = *(FieldDescriptor **)(*(long *)(lVar21 + 0x20 + lVar22) + lVar16 * 8);
            if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
              local_68._0_8_ = FieldDescriptor::TypeOnceInit;
              local_90 = pFVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(pFVar1 + 0x30),(_func_void_FieldDescriptor_ptr **)local_68,
                         &local_90);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar1 + 0x38) * 4) -
                1U < 10) {
              iVar14 = *(int *)(&DAT_00574948 +
                               (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(uint *)(pFVar1 + 0x38) * 4) - 1U) * 4);
            }
            else {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
                         ,0xd1);
              pLVar11 = internal::LogMessage::operator<<((LogMessage *)local_68,"Can\'t get here.");
              internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar11);
              internal::LogMessage::~LogMessage((LogMessage *)local_68);
              iVar14 = 0;
            }
            iVar20 = iVar20 + iVar14 + -1;
            if (pFVar1[0x42] == (FieldDescriptor)0x0) {
              plVar12 = (long *)(*(long *)(pFVar1 + 0x50) + 0x28);
            }
            else if (*(long *)(pFVar1 + 0x60) == 0) {
              plVar12 = (long *)(*(long *)(pFVar1 + 0x28) + 0x80);
            }
            else {
              plVar12 = (long *)(*(long *)(pFVar1 + 0x60) + 0x50);
            }
            uVar15 = iVar20 - iVar20 % iVar14;
            local_88[(int)((ulong)((long)pFVar1 - *plVar12) >> 3) * 0x286bca1b] = uVar15;
            iVar20 = uVar15 + iVar14;
            lVar16 = lVar16 + 1;
            lVar21 = *(long *)(local_98 + 0x30);
          } while (lVar16 < *(int *)(lVar21 + 0x18 + lVar22));
        }
        lVar16 = local_70 + 1;
      } while (lVar16 < *(int *)(local_98 + 0x6c));
    }
    uVar15 = iVar20 + 0xe;
    if (-1 < (int)(iVar20 + 7U)) {
      uVar15 = iVar20 + 7U;
    }
    this_00 = (DynamicMessage *)operator_new((long)(int)(uVar15 & 0xfffffff8));
    memset(this_00,0,(long)(int)(uVar15 & 0xfffffff8));
    pTVar8 = local_80;
    DynamicMessage::DynamicMessage(this_00,local_80,false);
    if (0 < *(int *)(local_98 + 0x6c)) {
      ConstructDefaultOneofInstance
                (pTVar8->type,
                 (pTVar8->offsets)._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                 super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,this_00);
    }
    local_68._0_8_ = pTVar8->prototype;
    local_68._8_8_ =
         (pTVar8->offsets)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_68._16_8_ =
         (pTVar8->has_bits_indices)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_50 = pTVar8->has_bits_offset;
    iStack_44 = pTVar8->oneof_case_offset;
    iStack_4c = pTVar8->internal_metadata_offset;
    iStack_48 = pTVar8->extensions_offset;
    local_40._M_allocated_capacity._0_4_ = pTVar8->size;
    local_40._M_allocated_capacity._4_4_ = pTVar8->weak_field_map_offset;
    this_01 = (Reflection *)operator_new(0x50);
    Reflection::Reflection
              (this_01,pTVar8->type,(ReflectionSchema *)local_68,pTVar8->pool,
               &local_78->super_MessageFactory);
    pRVar3 = (pTVar8->reflection)._M_t.
             super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
             .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl;
    (pTVar8->reflection)._M_t.
    super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
    .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl = this_01;
    if (pRVar3 != (Reflection *)0x0) {
      operator_delete(pRVar3);
    }
    DynamicMessage::CrossLinkPrototypes(this_00);
  }
  else {
    this_00 = (*ppTVar7)->prototype;
  }
  return &this_00->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const DynamicMessage::TypeInfo** target = &prototypes_->map_[type];
  if (*target != NULL) {
    // Already exists.
    return (*target)->prototype;
  }

  DynamicMessage::TypeInfo* type_info = new DynamicMessage::TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == NULL) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.

  // Compute size and offsets.
  uint32* offsets = new uint32[type->field_count() + type->oneof_decl_count()];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  if (type->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    type_info->has_bits_offset = -1;
  } else {
    type_info->has_bits_offset = size;
    int has_bits_array_size =
        DivideRoundingUp(type->field_count(), bitsizeof(uint32));
    size += has_bits_array_size * sizeof(uint32);
    size = AlignOffset(size);

    uint32* has_bits_indices = new uint32[type->field_count()];
    for (int i = 0; i < type->field_count(); i++) {
      has_bits_indices[i] = i;
    }
    type_info->has_bits_indices.reset(has_bits_indices);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (type->oneof_decl_count() > 0) {
    type_info->oneof_case_offset = size;
    size += type->oneof_decl_count() * sizeof(uint32);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  int num_weak_fields = 0;
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!type->field(i)->containing_oneof()) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  // Add the InternalMetadataWithArena to the end.
  size = AlignOffset(size);
  type_info->internal_metadata_offset = size;
  size += sizeof(InternalMetadataWithArena);

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  if (type->oneof_decl_count() > 0) {
    // Compute the size of default oneof instance and offsets of default
    // oneof fields.
    for (int i = 0; i < type->oneof_decl_count(); i++) {
      for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = type->oneof_decl(i)->field(j);
        int field_size = OneofFieldSpaceUsed(field);
        size = AlignTo(size, std::min(kSafeAlignment, field_size));
        offsets[field->index()] = size;
        size += field_size;
      }
    }
  }
  size = AlignOffset(size);
  // Allocate the prototype + oneof fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  if (type->oneof_decl_count() > 0 || num_weak_fields > 0) {
    // Construct default oneof instance.
    ConstructDefaultOneofInstance(type_info->type, type_info->offsets.get(),
                                  prototype);
  }

  internal::ReflectionSchema schema = {type_info->prototype,
                                       type_info->offsets.get(),
                                       type_info->has_bits_indices.get(),
                                       type_info->has_bits_offset,
                                       type_info->internal_metadata_offset,
                                       type_info->extensions_offset,
                                       type_info->oneof_case_offset,
                                       type_info->size,
                                       type_info->weak_field_map_offset};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}